

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

void __thiscall
Js::TypedArrayBase::SetObject
          (TypedArrayBase *this,RecyclableObject *source,uint32 targetLength,uint32 offset)

{
  BOOL BVar1;
  JavascriptLibrary *this_00;
  RecyclableObject *pRVar2;
  uint local_44;
  uint32 i;
  Var undefinedValue;
  Var itemValue;
  ScriptContext *pSStack_28;
  uint32 sourceLength;
  ScriptContext *scriptContext;
  uint32 offset_local;
  uint32 targetLength_local;
  RecyclableObject *source_local;
  TypedArrayBase *this_local;
  
  scriptContext._0_4_ = offset;
  scriptContext._4_4_ = targetLength;
  _offset_local = source;
  source_local = (RecyclableObject *)this;
  pSStack_28 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  itemValue._4_4_ = GetSourceLength(this,_offset_local,scriptContext._4_4_,(uint32)scriptContext);
  this_00 = ScriptContext::GetLibrary(pSStack_28);
  pRVar2 = JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
  for (local_44 = 0; local_44 < itemValue._4_4_; local_44 = local_44 + 1) {
    BVar1 = RecyclableObject::GetItem
                      (_offset_local,_offset_local,local_44,&undefinedValue,pSStack_28);
    if (BVar1 == 0) {
      undefinedValue = pRVar2;
    }
    (*(this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x70])
              (this,(ulong)((uint32)scriptContext + local_44),undefinedValue);
  }
  return;
}

Assistant:

void TypedArrayBase::SetObject(RecyclableObject* source, uint32 targetLength, uint32 offset)
    {
        ScriptContext* scriptContext = GetScriptContext();
        uint32 sourceLength = GetSourceLength(source, targetLength, offset);

        Var itemValue;
        Var undefinedValue = scriptContext->GetLibrary()->GetUndefined();
        for (uint32 i = 0; i < sourceLength; i ++)
        {
            if (!source->GetItem(source, i, &itemValue, scriptContext))
            {
                itemValue = undefinedValue;
            }
            DirectSetItem(offset + i, itemValue);
        }
    }